

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O3

maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
* __thiscall
rangeless::fn::impl::
group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::
gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
::operator()(maybe<rangeless::fn::impl::seq<rangeless::fn::impl::group_adjacent_as_subseqs_by<rangeless::fn::by::identity,_rangeless::fn::impl::eq>::gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>::subgen>_>
             *__return_storage_ptr__,
            gen<rangeless::fn::impl::to_seq::gen<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
            *this)

{
  byte bVar1;
  pointer pXVar2;
  pointer pXVar3;
  char local_1c;
  
  bVar1 = (this->current).m_empty;
  if ((bool)bVar1 == false) {
    if (this->reached_subend == false) {
      do {
        next(this);
        if (local_1c == '\0') {
          local_1c = '\x01';
        }
      } while (this->reached_subend != true);
      bVar1 = (this->current).m_empty;
    }
  }
  else {
    if ((this->in_gen).started == false) {
      (this->in_gen).started = true;
      pXVar2 = (this->in_gen).inps.
               super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pXVar3 = (this->in_gen).inps.
               super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
               _M_impl.super__Vector_impl_data._M_finish;
LAB_0016ffc6:
      (this->in_gen).it._M_current = pXVar2;
    }
    else {
      pXVar3 = (this->in_gen).inps.
               super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pXVar2 = (this->in_gen).it._M_current;
      if (pXVar2 != pXVar3) {
        pXVar2 = pXVar2 + 1;
        goto LAB_0016ffc6;
      }
    }
    if (pXVar2 != pXVar3) {
      (this->current).field_0 =
           (anon_union_4_2_edcbc2ec_for_maybe<rangeless::fn::impl::X>_1)pXVar2->value;
      (this->current).m_empty = false;
      goto LAB_0016ffe6;
    }
  }
  if ((bVar1 & 1) != 0) {
    __return_storage_ptr__->m_empty = true;
    return __return_storage_ptr__;
  }
LAB_0016ffe6:
  this->reached_subend = false;
  *(undefined1 *)((long)&__return_storage_ptr__->field_0 + 4) = 1;
  (__return_storage_ptr__->field_0).m_value.m_gen.parent = this;
  *(undefined2 *)((long)&__return_storage_ptr__->field_0 + 0x10) = 0;
  (__return_storage_ptr__->field_0).m_value.m_resumable = false;
  __return_storage_ptr__->m_empty = false;
  return __return_storage_ptr__;
}

Assistant:

maybe<value_type> operator()() // return seq for next group
            {
                if(!current) { // starting initial group
                    current = in_gen();
                } else {

                    // NB: the user-code may have accessed the group only
                    // partially (or not at all), in which case we must skip
                    // over the rest elements in the group until we reach 
                    // the next one.
                    while(!reached_subend) {
                        next();
                    }
                }

                if(!current) { // reached final end
                    return {};
                }

                reached_subend = false;
                return { subgen{ this } };
            }